

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O2

void __thiscall CSocekt::flyd_wait_request_handler_proc_plast(CSocekt *this,lp_connection_t c)

{
  function<void_()> tCall;
  int local_74;
  function<void_()> local_70;
  function<void_()> local_50;
  _Bind<void_(CLogicSocket::*(CLogicSocket_*))()> local_30;
  
  inMsgRecvQueue(this,c->pnewMemPointer,&local_74);
  local_30._M_f = 0x31;
  local_30._8_8_ = 0;
  local_30._M_bound_args.super__Tuple_impl<0UL,_CLogicSocket_*>.
  super__Head_base<0UL,_CLogicSocket_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_CLogicSocket_*>)&g_socket;
  std::function<void()>::function<std::_Bind<void(CLogicSocket::*(CLogicSocket*))()>,void>
            ((function<void()> *)&local_50,&local_30);
  std::function<void_()>::function(&local_70,&local_50);
  muduo::ThreadPool::run(&g_threadpool,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  c->ifnewrecvMem = false;
  c->pnewMemPointer = (char *)0x0;
  c->curStat = '\0';
  c->precvbuf = c->dataHeadInfo;
  c->irecvlen = (uint)this->m_iLenPkgHeader;
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  return;
}

Assistant:

void CSocekt::flyd_wait_request_handler_proc_plast(lp_connection_t c)
{
    //把这段内存放到消息队列中来；
   // inMsgRecvQueue(c->pnewMemPointer);
    //......这里可能考虑触发业务逻辑，怎么触发业务逻辑，这个代码以后再考虑扩充。。。。。。

    int irmqc = 0; //表示消息队列当前信息数量
    inMsgRecvQueue(c->pnewMemPointer, irmqc);

    std::function<void ()> tCall = std::bind(&CLogicSocket::threadRecvProcFunc,
                                            &g_socket);

    g_threadpool.run(tCall);

    c->ifnewrecvMem    = false;            //内存不再需要释放，因为你收完整了包，这个包被上边调用inMsgRecvQueue()移入消息队列，那么释放内存就属于业务逻辑去干，不需要回收连接到连接池中干了
    c->pnewMemPointer  = NULL;
    c->curStat         = _PKG_HD_INIT;     //收包状态机的状态恢复为原始态，为收下一个包做准备
    c->precvbuf        = c->dataHeadInfo;  //设置好收包的位置
    c->irecvlen        = m_iLenPkgHeader;  //设置好要接收数据的大小
    return;
}